

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O3

void __thiscall
wasm::FindAllPointers<wasm::LocalGet>::FindAllPointers
          (FindAllPointers<wasm::LocalGet> *this,Expression **ast)

{
  undefined1 auStack_108 [8];
  PointerFinder finder;
  
  (this->list).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  replacep = (Expression **)0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  stack.fixed._M_elems[9].currp = (Expression **)0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  stack.flexible.
  super__Vector_base<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  stack.flexible.
  super__Vector_base<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  stack.flexible.
  super__Vector_base<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  currFunction = (Function *)0x0;
  finder.
  super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>.
  currModule._0_4_ = 8;
  finder._216_8_ = this;
  Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::walk
            ((Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
              *)auStack_108,ast);
  if (finder.
      super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
      .super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(finder.
                    super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
                    .
                    super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)finder.
                          super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
                          .
                          super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
                          .
                          super_Walker<wasm::PointerFinder,_wasm::UnifiedExpressionVisitor<wasm::PointerFinder,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

FindAllPointers(Expression*& ast) {
    PointerFinder finder;
    finder.id = (Expression::Id)T::SpecificId;
    finder.list = &list;
    finder.walk(ast);
  }